

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::changeRange
          (SPxSolverBase<double> *this,int i,double *newLhs,double *newRhs,bool scale)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Real RVar5;
  
  dVar1 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[i];
  dVar2 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[i];
  SPxLPBase<double>::changeLhs(&this->super_SPxLPBase<double>,i,newLhs,scale);
  dVar3 = *newLhs;
  dVar4 = *newRhs;
  RVar5 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr);
  if (RVar5 < ABS(dVar3 - dVar4)) {
    newLhs = newRhs;
  }
  SPxLPBase<double>::changeRhs(&this->super_SPxLPBase<double>,i,newLhs,scale);
  if (NO_PROBLEM < (this->super_SPxBasisBase<double>).thestatus) {
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6b])
              ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[i],dVar1,this,(ulong)(uint)i);
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x6c])
              ((this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[i],dVar2,this,(ulong)(uint)i);
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x77])(this);
    return;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeRange(int i, const R& newLhs, const R& newRhs, bool scale)
{
   R oldLhs = this->lhs(i);
   R oldRhs = this->rhs(i);

   SPxLPBase<R>::changeLhs(i, newLhs, scale);

   if(EQ(newLhs, newRhs, this->tolerances()->epsilon()))
      SPxLPBase<R>::changeRhs(i, newLhs, scale);
   else
      SPxLPBase<R>::changeRhs(i, newRhs, scale);

   if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
   {
      changeLhsStatus(i, this->lhs(i), oldLhs);
      changeRhsStatus(i, this->rhs(i), oldRhs);
      unInit();
   }
}